

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::rk(Graph *this,char *word,char *text,int q)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  
  sVar1 = strlen(word);
  sVar2 = strlen(text);
  iVar12 = (int)sVar1;
  if (iVar12 <= (int)sVar2) {
    uVar7 = (ulong)q;
    iVar9 = 1;
    if (1 < iVar12) {
      iVar9 = iVar12;
    }
    lVar4 = 1;
    while (iVar9 = iVar9 + -1, iVar9 != 0) {
      lVar4 = (lVar4 * 0x1a) % (long)uVar7;
    }
    uVar10 = 0;
    uVar14 = 0;
    if (0 < iVar12) {
      uVar14 = sVar1 & 0xffffffff;
    }
    lVar5 = 0;
    lVar6 = 0;
    for (; uVar14 != uVar10; uVar10 = uVar10 + 1) {
      lVar5 = ((long)word[uVar10] + lVar5 * 0x1a) % (long)uVar7;
      lVar6 = ((long)text[uVar10] + lVar6 * 0x1a) % (long)uVar7;
    }
    lVar11 = (long)((int)sVar2 - iVar12);
    pcVar8 = text;
    for (lVar13 = 0; lVar13 <= lVar11; lVar13 = lVar13 + 1) {
      if (lVar5 == lVar6) {
        for (uVar10 = 0;
            (uVar3 = uVar14, uVar14 != uVar10 && (uVar3 = uVar10, pcVar8[uVar10] == word[uVar10]));
            uVar10 = uVar10 + 1) {
        }
        if ((int)uVar3 == iVar12) {
          addEdge(this,(int)lVar13,(int)lVar13 + iVar12);
        }
      }
      if (lVar13 < lVar11) {
        lVar6 = ((long)text[lVar13 + iVar12] + (lVar6 - text[lVar13] * lVar4) * 0x1a) % (long)uVar7;
        lVar6 = (lVar6 >> 0x3f & uVar7) + lVar6;
      }
      pcVar8 = pcVar8 + 1;
    }
  }
  return;
}

Assistant:

void Graph::rk(const char *word, const char *text, int q) {
    int wordLength = strlen(word);
    int textLength = strlen(text);
    int i,j;
    long long wordHash = 0;
    long long textHash = 0;
    long long h = 1;
    if(wordLength>textLength){
        return;
    }
    for ( i = 0; i < wordLength-1; i++) {
        h = (h * alphabet) % q;
    }
    for ( i = 0; i < wordLength; i++) {
        wordHash = (alphabet*wordHash + word[i])%q;
        textHash = (alphabet*textHash + text[i])%q;
    }
    for ( i = 0; i <= textLength - wordLength; i++) {
        if ( wordHash == textHash ) {
            for ( j = 0; j < wordLength; j++) {
                if (text[i+j] != word[j]) {
                    break;
                }
            }
            if (j == wordLength) {
                addEdge(i, i + wordLength);
            }
        }
        if ( i < textLength-wordLength ) {
            textHash = (alphabet*(textHash - text[i]*h) + text[i+wordLength])%q;
            if (textHash < 0)
                textHash = (textHash + q);
        }
    }
}